

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupDfsNode(Gia_Man_t *p,Gia_Obj_t *pRoot)

{
  Gia_Man_t *pNew;
  char *pcVar1;
  
  if ((-1 < (int)(uint)*(undefined8 *)pRoot) &&
     (((uint)*(undefined8 *)pRoot & 0x1fffffff) != 0x1fffffff)) {
    Gia_ManFillValue(p);
    pNew = Gia_ManStart(p->nObjs);
    pcVar1 = Abc_UtilStrsav(p->pName);
    pNew->pName = pcVar1;
    pcVar1 = Abc_UtilStrsav(p->pSpec);
    pNew->pSpec = pcVar1;
    p->pObjs->Value = 0;
    Gia_ManDupDfs3_rec(pNew,p,pRoot);
    Gia_ManAppendCo(pNew,pRoot->Value);
    return pNew;
  }
  __assert_fail("Gia_ObjIsAnd(pRoot)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                ,0x815,"Gia_Man_t *Gia_ManDupDfsNode(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

Gia_Man_t * Gia_ManDupDfsNode( Gia_Man_t * p, Gia_Obj_t * pRoot )
{
    Gia_Man_t * pNew;
    assert( Gia_ObjIsAnd(pRoot) );
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManDupDfs3_rec( pNew, p, pRoot );
    Gia_ManAppendCo( pNew, pRoot->Value );
    return pNew;
}